

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

void __thiscall
pbrt::HairBxDF::HairBxDF
          (HairBxDF *this,Float h,Float eta,SampledSpectrum *sigma_a,Float beta_m,Float beta_n,
          Float alpha)

{
  undefined8 uVar1;
  bool bVar2;
  long lVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 extraout_var [60];
  Float FVar10;
  
  auVar8._4_60_ = in_register_00001204;
  auVar8._0_4_ = h;
  auVar7 = auVar8._0_16_;
  this->h = h;
  auVar4 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar7);
  uVar1 = vcmpss_avx512f(auVar7,SUB6416(ZEXT464(0xbf800000),0),1);
  bVar2 = (bool)((byte)uVar1 & 1);
  fVar5 = asinf((float)((uint)bVar2 * -0x40800000 + (uint)!bVar2 * auVar4._0_4_));
  this->gamma_o = fVar5;
  this->eta = eta;
  uVar1 = *(undefined8 *)((sigma_a->values).values + 2);
  *(undefined8 *)(this->sigma_a).values.values = *(undefined8 *)(sigma_a->values).values;
  *(undefined8 *)((this->sigma_a).values.values + 2) = uVar1;
  this->beta_m = beta_m;
  this->beta_n = beta_n;
  auVar4._8_4_ = 0x7fffffff;
  auVar4._0_8_ = 0x7fffffff7fffffff;
  auVar4._12_4_ = 0x7fffffff;
  auVar4 = vandps_avx512vl(auVar7,auVar4);
  if (1.0 < auVar4._0_4_) {
    LogFatal<char_const(&)[18]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.cpp"
               ,0x137,"Check failed: %s",(char (*) [18])"h >= -1 && h <= 1");
  }
  if ((0.0 <= beta_m) && (beta_m <= 1.0)) {
    if ((0.0 <= beta_n) && (beta_n <= 1.0)) {
      fVar5 = beta_m * beta_m;
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * 0.812)),ZEXT416((uint)beta_m),
                               ZEXT416(0x3f39db23));
      fVar5 = fVar5 * fVar5 * beta_m;
      fVar5 = fVar5 * fVar5;
      auVar4 = vfmadd132ss_fma(ZEXT416((uint)(fVar5 * fVar5)),auVar4,ZEXT416(0x406ccccd));
      fVar5 = auVar4._0_4_ * auVar4._0_4_;
      this->v[0] = fVar5;
      this->v[1] = fVar5 * 0.25;
      this->v[2] = fVar5 * 4.0;
      this->v[3] = fVar5 * 4.0;
      fVar5 = beta_n * beta_n;
      auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * 1.194)),ZEXT416((uint)beta_n),
                               ZEXT416(0x3e87ae14));
      fVar5 = fVar5 * fVar5 * beta_n;
      fVar5 = fVar5 * fVar5 * beta_n;
      auVar4 = vfmadd132ss_fma(ZEXT416((uint)(fVar5 * fVar5)),auVar4,ZEXT416(0x40abe76d));
      fVar5 = auVar4._0_4_ * 0.62665707;
      this->s = fVar5;
      if (!NAN(fVar5)) {
        fVar5 = sinf(alpha * 0.017453292);
        this->sin2kAlpha[0] = fVar5;
        auVar7._0_12_ = ZEXT812(0);
        auVar7._12_4_ = 0;
        auVar4 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar5 * fVar5)),auVar7);
        if (auVar4._0_4_ < 0.0) {
          auVar9._0_4_ = sqrtf(auVar4._0_4_);
          auVar9._4_60_ = extraout_var;
        }
        else {
          auVar4 = vsqrtss_avx(auVar4,auVar4);
          auVar9 = ZEXT1664(auVar4);
        }
        this->cos2kAlpha[0] = auVar9._0_4_;
        FVar10 = this->sin2kAlpha[0];
        lVar3 = 0;
        do {
          fVar6 = auVar9._0_4_;
          fVar5 = FVar10 * FVar10;
          FVar10 = (fVar6 + fVar6) * FVar10;
          this->sin2kAlpha[lVar3 + 1] = FVar10;
          fVar5 = fVar6 * fVar6 - fVar5;
          auVar9 = ZEXT464((uint)fVar5);
          this->cos2kAlpha[lVar3 + 1] = fVar5;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 2);
        return;
      }
      LogFatal<char_const(&)[10]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.cpp"
                 ,0x147,"Check failed: %s",(char (*) [10])"!IsNaN(s)");
    }
    LogFatal<char_const(&)[27]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.cpp"
               ,0x139,"Check failed: %s",(char (*) [27])"beta_n >= 0 && beta_n <= 1");
  }
  LogFatal<char_const(&)[27]>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/bxdfs.cpp"
             ,0x138,"Check failed: %s",(char (*) [27])"beta_m >= 0 && beta_m <= 1");
}

Assistant:

HairBxDF::HairBxDF(Float h, Float eta, const SampledSpectrum &sigma_a, Float beta_m,
                   Float beta_n, Float alpha)
    : h(h),
      gamma_o(SafeASin(h)),
      eta(eta),
      sigma_a(sigma_a),
      beta_m(beta_m),
      beta_n(beta_n) {
    CHECK(h >= -1 && h <= 1);
    CHECK(beta_m >= 0 && beta_m <= 1);
    CHECK(beta_n >= 0 && beta_n <= 1);
    // Compute longitudinal variance from $\beta_m$
    static_assert(pMax >= 3,
                  "Longitudinal variance code must be updated to handle low pMax");
    v[0] = Sqr(0.726f * beta_m + 0.812f * Sqr(beta_m) + 3.7f * Pow<20>(beta_m));
    v[1] = .25 * v[0];
    v[2] = 4 * v[0];
    for (int p = 3; p <= pMax; ++p)
        // TODO: is there anything better here?
        v[p] = v[2];

    // Compute azimuthal logistic scale factor from $\beta_n$
    static const Float SqrtPiOver8 = 0.626657069f;
    s = SqrtPiOver8 * (0.265f * beta_n + 1.194f * Sqr(beta_n) + 5.372f * Pow<22>(beta_n));
    CHECK(!IsNaN(s));

    // Compute $\alpha$ terms for hair scales
    sin2kAlpha[0] = std::sin(Radians(alpha));
    cos2kAlpha[0] = SafeSqrt(1 - Sqr(sin2kAlpha[0]));
    for (int i = 1; i < 3; ++i) {
        sin2kAlpha[i] = 2 * cos2kAlpha[i - 1] * sin2kAlpha[i - 1];
        cos2kAlpha[i] = Sqr(cos2kAlpha[i - 1]) - Sqr(sin2kAlpha[i - 1]);
    }
}